

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse_number_int(parser *this,token *t)

{
  string *psVar1;
  long *plVar2;
  reader *this_00;
  json_parser_exception *this_01;
  size_t byte_index;
  token *in_RDX;
  int i;
  istringstream is;
  int local_1a4;
  istringstream local_1a0 [120];
  ios_base local_128 [264];
  
  psVar1 = token::get_raw_value_abi_cxx11_(in_RDX);
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)psVar1,_S_in);
  plVar2 = (long *)std::istream::operator>>((istream *)local_1a0,&local_1a4);
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
    this_00 = (reader *)operator_new(0x58);
    json::json((json *)this_00,local_1a4);
    this->m_reader = this_00;
  }
  else {
    if ((t->m_raw_value).field_2._M_local_buf[9] != '\x01') {
      this_01 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
      psVar1 = token::get_raw_value_abi_cxx11_(in_RDX);
      byte_index = reader::get_byte_index((reader *)t->_vptr_token);
      json_parser_exception::json_parser_exception(this_01,number_out_of_range_e,psVar1,byte_index);
      __cxa_throw(this_01,&json_parser_exception::typeinfo,std::exception::~exception);
    }
    parse_number_double(this,t);
  }
  std::__cxx11::istringstream::~istringstream(local_1a0);
  std::ios_base::~ios_base(local_128);
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse_number_int(const token &t)
{
    istringstream is(t.get_raw_value());

    int i;

    if (is >> i)
    {
        return unique_ptr<json>(new json(i));
    }
    else
    {
        // We know the int is syntactically correct so this has to be a range error.
        if (m_fallback_to_double)
        {
            return parse_number_double(t);
        }
        else
        {
            throw json_parser_exception(
                        json_parser_exception::number_out_of_range_e,
                        t.get_raw_value(),
                        m_reader.get_byte_index());
        }
    }
}